

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tools_class.cpp
# Opt level: O0

void __thiscall test_tools::test_key_value_pair::test_method(test_key_value_pair *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  pointer pcVar4;
  allocator<char> local_189;
  string local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_cstring<const_char> local_148;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_138;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c0;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unique_ptr<tools::connection_option,_std::default_delete<tools::connection_option>_> local_18;
  unique_ptr<tools::connection_option,_std::default_delete<tools::connection_option>_> p;
  test_key_value_pair *this_local;
  
  p._M_t.
  super___uniq_ptr_impl<tools::connection_option,_std::default_delete<tools::connection_option>_>.
  _M_t.
  super__Tuple_impl<0UL,_tools::connection_option_*,_std::default_delete<tools::connection_option>_>
  .super__Head_base<0UL,_tools::connection_option_*,_false>._M_head_impl =
       (__uniq_ptr_data<tools::connection_option,_std::default_delete<tools::connection_option>,_true,_true>
        )(__uniq_ptr_data<tools::connection_option,_std::default_delete<tools::connection_option>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"driver",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"QIBASE",&local_71);
  tools::make_key_value_pair<std::__cxx11::string,std::__cxx11::string>
            ((tools *)&local_18,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
               ,0x68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_98);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0x46,&local_98);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c0,plVar3,(char (*) [1])0x1bdec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
               ,0x68);
    pcVar4 = std::
             unique_ptr<tools::connection_option,_std::default_delete<tools::connection_option>_>::
             operator->(&local_18);
    tools::connection_option::key<std::__cxx11::string,std::__cxx11::string>(&local_f0,pcVar4);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (&local_c0,&local_d0,0x46,1,2,&local_f0,"(p->key<std::string, std::string>())",
               "driver","\"driver\"");
    std::__cxx11::string::~string((string *)&local_f0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
               ,0x68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_110);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_100,0x47,&local_110);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_138,plVar3,(char (*) [1])0x1bdec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_tools_class.cpp"
               ,0x68);
    pcVar4 = std::
             unique_ptr<tools::connection_option,_std::default_delete<tools::connection_option>_>::
             operator->(&local_18);
    tools::connection_option::value<std::__cxx11::string,std::__cxx11::string>(&local_168,pcVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"QIBASE",&local_189);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_138,&local_148,0x47,1,2,&local_168,"(p->value<std::string, std::string>())",
               local_188,"std::string(\"QIBASE\")");
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string((string *)&local_168);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_138);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<tools::connection_option,_std::default_delete<tools::connection_option>_>::
  ~unique_ptr(&local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_key_value_pair)
{
    auto p{tools::make_key_value_pair(std::string("driver"), std::string("QIBASE"))};
    BOOST_CHECK_EQUAL((p->key<std::string, std::string>()), "driver");
    BOOST_CHECK_EQUAL((p->value<std::string, std::string>()), std::string("QIBASE"));
}